

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_RecoveryWithEmptyLog_Test::~DBTest_RecoveryWithEmptyLog_Test
          (DBTest_RecoveryWithEmptyLog_Test *this)

{
  DBTest_RecoveryWithEmptyLog_Test *this_local;
  
  DBTest::~DBTest(&this->super_DBTest);
  return;
}

Assistant:

TEST_F(DBTest, RecoveryWithEmptyLog) {
  do {
    ASSERT_LEVELDB_OK(Put("foo", "v1"));
    ASSERT_LEVELDB_OK(Put("foo", "v2"));
    Reopen();
    Reopen();
    ASSERT_LEVELDB_OK(Put("foo", "v3"));
    Reopen();
    ASSERT_EQ("v3", Get("foo"));
  } while (ChangeOptions());
}